

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

string_view_type __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::as_string_view
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this)

{
  pointer phVar1;
  json_runtime_error<std::domain_error,_void> *this_00;
  string_view_type sVar2;
  allocator<char> local_31;
  string local_30;
  
  switch(*(byte *)&this->field_0 & 0xf) {
  case 7:
    sVar2._M_str = (char *)((long)&this->field_0 + 2);
    sVar2._M_len = (ulong)(*(byte *)&this->field_0 >> 4);
    break;
  case 8:
  case 9:
    sVar2 = as_string_view((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)(this->field_0).long_str_.ptr_);
    break;
  default:
    this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Not a string",&local_31)
    ;
    json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_30);
    __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  case 0xf:
    phVar1 = (this->field_0).long_str_.ptr_;
    sVar2._M_str = phVar1->p_;
    sVar2._M_len = phVar1->length_;
  }
  return sVar2;
}

Assistant:

string_view_type as_string_view() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                    return string_view_type(cast<short_string_storage>().data(),cast<short_string_storage>().length());
                case json_storage_kind::long_str:
                    return string_view_type(cast<long_string_storage>().data(),cast<long_string_storage>().length());
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_string_view();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_string_view();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a string"));
            }
        }